

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

void Vec_WrdPush(Vec_Wrd_t *p,word Entry)

{
  int iVar1;
  word Entry_local;
  Vec_Wrd_t *p_local;
  
  if (p->nSize == p->nCap) {
    if (p->nCap < 0x10) {
      Vec_WrdGrow(p,0x10);
    }
    else {
      Vec_WrdGrow(p,p->nCap << 1);
    }
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPush( Vec_Wrd_t * p, word Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}